

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetLinSysFn(void *cvode_mem,CVLsLinSysFn linsys)

{
  int iVar1;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeMem local_20;
  CVLsMem local_18;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetLinSysFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (linsys == (CVLsLinSysFn)0x0) {
      local_18->user_linsys = 0;
      local_18->linsys = cvLsLinSys;
    }
    else {
      if (local_18->A == (SUNMatrix)0x0) {
        cvProcessError(local_20,-3,0x28b,"CVodeSetLinSysFn",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                       ,"Linear system setup routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      local_18->user_linsys = 1;
      local_18->linsys = linsys;
      local_20 = (CVodeMem)local_20->cv_user_data;
    }
    local_18->A_data = local_20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetLinSysFn(void* cvode_mem, CVLsLinSysFn linsys)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (cvls_mem->A == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return (CVLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL)
  {
    cvls_mem->user_linsys = SUNTRUE;
    cvls_mem->linsys      = linsys;
    cvls_mem->A_data      = cv_mem->cv_user_data;
  }
  else
  {
    cvls_mem->user_linsys = SUNFALSE;
    cvls_mem->linsys      = cvLsLinSys;
    cvls_mem->A_data      = cv_mem;
  }

  return (CVLS_SUCCESS);
}